

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration.cpp
# Opt level: O2

double * numerary::Numerary::integrate_simpson
                   (_func_double_double *f,double *a,double *b,double *eps)

{
  uint uVar1;
  double *pdVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double local_58;
  double dStack_50;
  
  pdVar2 = (double *)operator_new__(0x10);
  dVar4 = *b;
  dVar14 = dVar4 - *a;
  dVar5 = *eps;
  dVar11 = 0.0;
  dVar13 = 0.0;
  dVar10 = *a;
  while (dVar10 < dVar4 - dVar5) {
    dVar4 = (*f)(dVar10);
    dVar5 = (*f)(dVar14 * 0.5 + dVar10);
    dVar6 = (*f)(dVar14 + dVar10);
    auVar9._8_8_ = dVar14;
    auVar9._0_8_ = dVar14;
    auVar9 = divpd(auVar9,_DAT_001af5e0);
    dVar7 = (*f)(dVar14 * 0.25 + dVar10);
    dVar8 = (*f)(dVar14 * 3.0 * 0.25 + dVar10);
    local_58 = auVar9._0_8_;
    dStack_50 = auVar9._8_8_;
    local_58 = (dVar6 + dVar8 * 4.0 + dVar5 + dVar5 + dVar7 * 4.0 + dVar4) * local_58;
    dVar7 = ABS((local_58 - (dVar6 + dVar5 * 4.0 + dVar4) * dStack_50) / 15.0);
    dVar4 = pow(dVar7 / *eps,0.2);
    dVar5 = *eps;
    dVar6 = dVar14 + dVar10;
    if (dVar5 <= dVar7) {
      dVar6 = dVar10;
    }
    dVar10 = 10000.0;
    if (dVar4 <= 10000.0) {
      dVar10 = dVar4;
    }
    dVar8 = 0.0001;
    if (0.0001 <= dVar10) {
      dVar8 = dVar10;
    }
    dVar8 = (dVar14 * 0.95) / dVar8;
    uVar1 = (uint)(dVar7 < dVar5);
    auVar12._0_8_ = CONCAT44((int)(uVar1 << 0x1f) >> 0x1f,(int)(uVar1 << 0x1f) >> 0x1f);
    auVar12._8_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
    auVar12._12_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
    dVar11 = (double)(~auVar12._0_8_ & (ulong)dVar11 | (ulong)(local_58 + dVar11) & auVar12._0_8_);
    dVar13 = (double)(~auVar12._8_8_ & (ulong)dVar13 | (ulong)(dVar7 + dVar13) & auVar12._8_8_);
    dVar4 = *b;
    uVar3 = -(ulong)(dVar4 < dVar8 + dVar6);
    dVar14 = (double)(~uVar3 & (ulong)dVar8 | (ulong)(dVar4 - dVar6) & uVar3);
    dVar10 = dVar6;
  }
  *pdVar2 = dVar11;
  pdVar2[1] = dVar13;
  return pdVar2;
}

Assistant:

double* Numerary::integrate_simpson(double (*f)(double), const double& a, const double& b, const double& eps)
    {
        double *return_value = new double[2], x = a, I_1, I_2, dt, chi, h = b - a, h_new, error = 0, ans = 0, fx_1, fx_2, fx_3;
        
        while (x < b - eps) {
            // Simpson's rule formulas
            fx_1 = f(x), fx_2 = f(x + h/2), fx_3 = f(x + h);
            I_1 = (h/6) * (fx_1 + 4*fx_2 + fx_3);
            I_2 = (h/12) * (fx_1 + 4*f(x + h/4) + 2*fx_2 + 4*f(x + (3*h)/4) + fx_3);

            dt = (I_2 - I_1) / 15;
            chi = pow(fabs(dt)/eps, 0.2);

            if(chi > 1e4) chi = 1e4;
            if(chi < 1e-4) chi = 1e-4;

            h_new = 0.95 * h / chi;

            if(fabs(dt) < eps) {
                x += h;
                ans += I_2;
                error += fabs(dt);
            }

            h = h_new;
            if(x + h > b) h = b - x;
        }

        return_value[0] = ans;
        return_value[1] = error;

        return return_value;
    }